

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decAbc.c
# Opt level: O0

Hop_Obj_t * Dec_GraphFactorSop(Hop_Man_t *pMan,char *pSop)

{
  Dec_Graph_t *pGraph;
  Dec_Node_t *pDVar1;
  Hop_Obj_t *pHVar2;
  int local_34;
  int i;
  Dec_Node_t *pNode;
  Dec_Graph_t *pFForm;
  Hop_Obj_t *pFunc;
  char *pSop_local;
  Hop_Man_t *pMan_local;
  
  pGraph = Dec_Factor(pSop);
  for (local_34 = 0; local_34 < pGraph->nLeaves; local_34 = local_34 + 1) {
    pDVar1 = Dec_GraphNode(pGraph,local_34);
    pHVar2 = Hop_IthVar(pMan,local_34);
    (pDVar1->field_2).pFunc = pHVar2;
  }
  pHVar2 = Dec_GraphToNetworkAig(pMan,pGraph);
  Dec_GraphFree(pGraph);
  return pHVar2;
}

Assistant:

Hop_Obj_t * Dec_GraphFactorSop( Hop_Man_t * pMan, char * pSop )
{
    Hop_Obj_t * pFunc;
    Dec_Graph_t * pFForm;
    Dec_Node_t * pNode;
    int i;
    // perform factoring
    pFForm = Dec_Factor( pSop );
    // collect the fanins
    Dec_GraphForEachLeaf( pFForm, pNode, i )
        pNode->pFunc = Hop_IthVar( pMan, i );
    // perform strashing
    pFunc = Dec_GraphToNetworkAig( pMan, pFForm );
    Dec_GraphFree( pFForm );
    return pFunc;
}